

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

ostream * anon_unknown.dwarf_e23c::operator<<(ostream *os,PrettyTime *rhs)

{
  ostream oVar1;
  ostream *poVar2;
  ostream *poVar3;
  long lVar4;
  char local_2d [5];
  
  lVar4 = (rhs->mTime).__r;
  if (lVar4 < 0) {
    local_2d[0] = '-';
    std::__ostream_insert<char,std::char_traits<char>>(os,local_2d,1);
    lVar4 = -lVar4;
  }
  if (lVar4 < 0xe10) {
    poVar2 = std::ostream::_M_insert<long>((long)os);
    local_2d[3] = 0x6d;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2d + 3,1);
    poVar2 = poVar3 + *(long *)(*(long *)poVar3 + -0x18);
    if (poVar3[*(long *)(*(long *)poVar3 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar1 = (ostream)std::ios::widen((char)poVar2);
      poVar2[0xe0] = oVar1;
      poVar2[0xe1] = (ostream)0x1;
    }
    poVar2[0xe0] = (ostream)0x30;
  }
  else {
    poVar2 = std::ostream::_M_insert<long>((long)os);
    local_2d[1] = 0x68;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2d + 1,1);
    poVar2 = poVar3 + *(long *)(*(long *)poVar3 + -0x18);
    if (poVar3[*(long *)(*(long *)poVar3 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar1 = (ostream)std::ios::widen((char)poVar2);
      poVar2[0xe0] = oVar1;
      poVar2[0xe1] = (ostream)0x1;
    }
    poVar2[0xe0] = (ostream)0x30;
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
    poVar2 = std::ostream::_M_insert<long>((long)poVar3);
    local_2d[2] = 0x6d;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2d + 2,1);
  }
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  poVar2 = std::ostream::_M_insert<long>((long)os);
  local_2d[4] = 0x73;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2d + 4,1);
  lVar4 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x10) = 0;
  lVar4 = *(long *)(lVar4 + -0x18);
  poVar2 = poVar3 + lVar4;
  if (poVar3[lVar4 + 0xe1] == (ostream)0x0) {
    oVar1 = (ostream)std::ios::widen((char)poVar2);
    poVar2[0xe0] = oVar1;
    poVar2[0xe1] = (ostream)0x1;
  }
  poVar2[0xe0] = (ostream)0x20;
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const PrettyTime &rhs)
{
    using hours = std::chrono::hours;
    using minutes = std::chrono::minutes;

    seconds t{rhs.mTime};
    if(t.count() < 0)
    {
        os << '-';
        t *= -1;
    }

    // Only handle up to hour formatting
    if(t >= hours{1})
        os << duration_cast<hours>(t).count() << 'h' << std::setfill('0') << std::setw(2)
           << (duration_cast<minutes>(t).count() % 60) << 'm';
    else
        os << duration_cast<minutes>(t).count() << 'm' << std::setfill('0');
    os << std::setw(2) << (duration_cast<seconds>(t).count() % 60) << 's' << std::setw(0)
       << std::setfill(' ');
    return os;
}